

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O3

int run_test_semaphore_3(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  undefined1 *unaff_RBX;
  uv_connect_t *puVar3;
  uv_shutdown_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_sem_t sem;
  void *pvStack_258;
  uv_shutdown_t auStack_250 [2];
  code *pcStack_160;
  code *pcStack_150;
  code *pcStack_148;
  uv_connect_t auStack_138 [2];
  code *pcStack_40;
  long local_38;
  long local_30;
  undefined1 local_28 [32];
  
  pcStack_40 = (code *)0x1ba795;
  iVar1 = uv_sem_init(local_28,3);
  local_30 = (long)iVar1;
  local_38 = 0;
  if (local_30 == 0) {
    unaff_RBX = local_28;
    pcStack_40 = (code *)0x1ba7c0;
    uv_sem_wait(unaff_RBX);
    pcStack_40 = (code *)0x1ba7c8;
    uv_sem_wait(unaff_RBX);
    pcStack_40 = (code *)0x1ba7d0;
    iVar1 = uv_sem_trywait(unaff_RBX);
    local_30 = (long)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001ba884;
    local_30 = -0xb;
    pcStack_40 = (code *)0x1ba801;
    iVar1 = uv_sem_trywait(local_28);
    local_38 = (long)iVar1;
    if (local_30 != local_38) goto LAB_001ba891;
    unaff_RBX = local_28;
    pcStack_40 = (code *)0x1ba81f;
    uv_sem_post(unaff_RBX);
    pcStack_40 = (code *)0x1ba827;
    iVar1 = uv_sem_trywait(unaff_RBX);
    local_30 = (long)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001ba89e;
    local_30 = -0xb;
    pcStack_40 = (code *)0x1ba854;
    iVar1 = uv_sem_trywait(local_28);
    local_38 = (long)iVar1;
    if (local_30 == local_38) {
      pcStack_40 = (code *)0x1ba86f;
      uv_sem_destroy(local_28);
      return 0;
    }
  }
  else {
    pcStack_40 = (code *)0x1ba884;
    run_test_semaphore_3_cold_1();
LAB_001ba884:
    pcStack_40 = (code *)0x1ba891;
    run_test_semaphore_3_cold_2();
LAB_001ba891:
    pcStack_40 = (code *)0x1ba89e;
    run_test_semaphore_3_cold_3();
LAB_001ba89e:
    pcStack_40 = (code *)0x1ba8ab;
    run_test_semaphore_3_cold_4();
  }
  pcStack_40 = run_test_shutdown_close_tcp;
  run_test_semaphore_3_cold_5();
  pcStack_148 = (code *)0x1ba8d6;
  pcStack_40 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&auStack_138[0].type);
  auStack_138[0].reserved[1] = (void *)(long)iVar1;
  auStack_138[0].data = (uv_loop_t *)0x0;
  if (auStack_138[0].reserved[1] == (void *)0x0) {
    pcStack_148 = (code *)0x1ba8fb;
    uVar2 = uv_default_loop();
    pcStack_148 = (code *)0x1ba908;
    iVar1 = uv_tcp_init(uVar2,auStack_138[0].reserved + 1);
    auStack_138[0].data = (void *)(long)iVar1;
    auStack_138[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_138[0].data != (uv_loop_t *)0x0) goto LAB_001baa6e;
    pcStack_148 = (code *)0x1ba945;
    iVar1 = uv_tcp_connect(&connect_req,auStack_138[0].reserved + 1,&auStack_138[0].type,connect_cb)
    ;
    auStack_138[0].data = (void *)(long)iVar1;
    auStack_138[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_138[0].data != (uv_loop_t *)0x0) goto LAB_001baa7d;
    pcStack_148 = (code *)0x1ba96a;
    uVar2 = uv_default_loop();
    pcStack_148 = (code *)0x1ba974;
    iVar1 = uv_run(uVar2,0);
    auStack_138[0].data = (void *)(long)iVar1;
    auStack_138[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_138[0].data != (uv_loop_t *)0x0) goto LAB_001baa8c;
    auStack_138[0].data = (uv_loop_t *)0x1;
    auStack_138[0].loop = (uv_loop_t *)(long)connect_cb_called;
    if (auStack_138[0].loop != (uv_loop_t *)0x1) goto LAB_001baa9b;
    auStack_138[0].data = (uv_loop_t *)0x1;
    auStack_138[0].loop = (uv_loop_t *)(long)shutdown_cb_called;
    if (auStack_138[0].loop != (uv_loop_t *)0x1) goto LAB_001baaaa;
    auStack_138[0].data = (uv_loop_t *)0x1;
    auStack_138[0].loop = (uv_loop_t *)(long)close_cb_called;
    if (auStack_138[0].loop != (uv_loop_t *)0x1) goto LAB_001baab9;
    pcStack_148 = (code *)0x1baa08;
    unaff_RBX = (undefined1 *)uv_default_loop();
    pcStack_148 = (code *)0x1baa1c;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_148 = (code *)0x1baa26;
    uv_run(unaff_RBX,0);
    auStack_138[0].data = (uv_loop_t *)0x0;
    pcStack_148 = (code *)0x1baa34;
    uVar2 = uv_default_loop();
    pcStack_148 = (code *)0x1baa3c;
    iVar1 = uv_loop_close(uVar2);
    auStack_138[0].loop = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_138[0].data == auStack_138[0].loop) {
      pcStack_148 = (code *)0x1baa54;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_148 = (code *)0x1baa6e;
    run_test_shutdown_close_tcp_cold_1();
LAB_001baa6e:
    pcStack_148 = (code *)0x1baa7d;
    run_test_shutdown_close_tcp_cold_2();
LAB_001baa7d:
    pcStack_148 = (code *)0x1baa8c;
    run_test_shutdown_close_tcp_cold_3();
LAB_001baa8c:
    pcStack_148 = (code *)0x1baa9b;
    run_test_shutdown_close_tcp_cold_4();
LAB_001baa9b:
    pcStack_148 = (code *)0x1baaaa;
    run_test_shutdown_close_tcp_cold_5();
LAB_001baaaa:
    pcStack_148 = (code *)0x1baab9;
    run_test_shutdown_close_tcp_cold_6();
LAB_001baab9:
    pcStack_148 = (code *)0x1baac8;
    run_test_shutdown_close_tcp_cold_7();
  }
  puVar3 = auStack_138;
  iVar1 = (int)auStack_138 + 8;
  pcStack_148 = connect_cb;
  run_test_shutdown_close_tcp_cold_8();
  if (puVar3 == &connect_req) {
    pcStack_148 = (code *)(long)iVar1;
    pcStack_150 = (code *)0x0;
    if (pcStack_148 != (code *)0x0) goto LAB_001babb9;
    pcStack_160 = (code *)0x1bab26;
    iVar1 = uv_shutdown(&shutdown_req,connect_req.handle,shutdown_cb);
    pcStack_148 = (code *)(long)iVar1;
    pcStack_150 = (code *)0x0;
    if (pcStack_148 != (code *)0x0) goto LAB_001babc8;
    pcStack_160 = (code *)0x1bab52;
    iVar1 = uv_is_closing(connect_req.handle);
    pcStack_148 = (code *)(long)iVar1;
    pcStack_150 = (code *)0x0;
    if (pcStack_148 != (code *)0x0) goto LAB_001babd7;
    pcStack_160 = (code *)0x1bab81;
    uv_close(connect_req.handle,close_cb);
    pcStack_148 = (code *)0x1;
    pcStack_160 = (code *)0x1bab96;
    iVar1 = uv_is_closing(connect_req.handle);
    pcStack_150 = (code *)(long)iVar1;
    if (pcStack_148 == pcStack_150) {
      connect_cb_called = connect_cb_called + 1;
      return (int)pcStack_148;
    }
  }
  else {
    pcStack_160 = (code *)0x1babb9;
    connect_cb_cold_1();
LAB_001babb9:
    pcStack_160 = (code *)0x1babc8;
    connect_cb_cold_2();
LAB_001babc8:
    pcStack_160 = (code *)0x1babd7;
    connect_cb_cold_3();
LAB_001babd7:
    pcStack_160 = (code *)0x1babe6;
    connect_cb_cold_4();
  }
  pcStack_160 = run_test_shutdown_close_pipe;
  connect_cb_cold_5();
  pcStack_160 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&auStack_250[0].loop,0);
  auStack_250[0].data = (void *)(long)iVar1;
  pvStack_258 = (void *)0x0;
  if (auStack_250[0].data == (void *)0x0) {
    uv_pipe_connect(&connect_req,&auStack_250[0].loop,"/tmp/uv-test-sock",connect_cb);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    auStack_250[0].data = (void *)(long)iVar1;
    pvStack_258 = (void *)0x0;
    if (auStack_250[0].data != (void *)0x0) goto LAB_001bad59;
    auStack_250[0].data = (void *)0x1;
    pvStack_258 = (void *)(long)connect_cb_called;
    if (pvStack_258 != (void *)0x1) goto LAB_001bad68;
    auStack_250[0].data = (void *)0x1;
    pvStack_258 = (void *)(long)shutdown_cb_called;
    if (pvStack_258 != (void *)0x1) goto LAB_001bad77;
    auStack_250[0].data = (void *)0x1;
    pvStack_258 = (void *)(long)close_cb_called;
    if (pvStack_258 == (void *)0x1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      auStack_250[0].data = (void *)0x0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      pvStack_258 = (void *)(long)iVar1;
      if (auStack_250[0].data == pvStack_258) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001bad95;
    }
  }
  else {
    run_test_shutdown_close_pipe_cold_1();
LAB_001bad59:
    run_test_shutdown_close_pipe_cold_2();
LAB_001bad68:
    run_test_shutdown_close_pipe_cold_3();
LAB_001bad77:
    run_test_shutdown_close_pipe_cold_4();
  }
  run_test_shutdown_close_pipe_cold_5();
LAB_001bad95:
  puVar4 = auStack_250;
  iVar1 = (int)&pvStack_258;
  run_test_shutdown_close_pipe_cold_6();
  if (puVar4 == &shutdown_req) {
    if ((iVar1 == -0x7d) || (iVar1 == 0)) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX;
    }
  }
  else {
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(semaphore_3) {
  uv_sem_t sem;

  ASSERT_OK(uv_sem_init(&sem, 3));
  uv_sem_wait(&sem); /* should not block */
  uv_sem_wait(&sem); /* should not block */
  ASSERT_OK(uv_sem_trywait(&sem));
  ASSERT_EQ(UV_EAGAIN, uv_sem_trywait(&sem));

  uv_sem_post(&sem);
  ASSERT_OK(uv_sem_trywait(&sem));
  ASSERT_EQ(UV_EAGAIN, uv_sem_trywait(&sem));

  uv_sem_destroy(&sem);

  return 0;
}